

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalDefaultHook(void *pClientData,sqlite3 *db,char *zDb,int nFrame)

{
  int nFrame_local;
  char *zDb_local;
  sqlite3 *db_local;
  void *pClientData_local;
  
  if ((int)pClientData <= nFrame) {
    sqlite3BeginBenignMalloc();
    sqlite3_wal_checkpoint(db,zDb);
    sqlite3EndBenignMalloc();
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalDefaultHook(
  void *pClientData,     /* Argument */
  sqlite3 *db,           /* Connection */
  const char *zDb,       /* Database */
  int nFrame             /* Size of WAL */
){
  if( nFrame>=SQLITE_PTR_TO_INT(pClientData) ){
    sqlite3BeginBenignMalloc();
    sqlite3_wal_checkpoint(db, zDb);
    sqlite3EndBenignMalloc();
  }
  return SQLITE_OK;
}